

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# difference_iterator.hpp
# Opt level: O2

void __thiscall
burst::
difference_iterator<std::_List_const_iterator<char>,_std::_List_const_iterator<char>,_std::greater<void>_>
::difference_iterator
          (difference_iterator<std::_List_const_iterator<char>,_std::_List_const_iterator<char>,_std::greater<void>_>
           *this,_List_node_base *minuend_begin,_List_node_base *minuend_end,
          _List_node_base *subtrahend_begin,_List_node_base *subtrahend_end)

{
  uint __line;
  bool bVar1;
  char *__assertion;
  
  (this->m_minuend_begin)._M_node = minuend_begin;
  (this->m_minuend_end)._M_node = minuend_end;
  (this->m_subtrahend_begin)._M_node = subtrahend_begin;
  (this->m_subtrahend_end)._M_node = subtrahend_end;
  bVar1 = std::is_sorted<std::_List_const_iterator<char>,std::greater<void>>
                    (minuend_begin,minuend_end);
  if (bVar1) {
    bVar1 = std::is_sorted<std::_List_const_iterator<char>,std::greater<void>>
                      ((this->m_subtrahend_begin)._M_node,(this->m_subtrahend_end)._M_node);
    if (bVar1) {
      maintain_invariant(this);
      return;
    }
    __assertion = "std::is_sorted(m_subtrahend_begin, m_subtrahend_end, compare)";
    __line = 0x6c;
  }
  else {
    __assertion = "std::is_sorted(m_minuend_begin, m_minuend_end, compare)";
    __line = 0x6b;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/difference_iterator.hpp"
                ,__line,
                "burst::difference_iterator<std::_List_const_iterator<char>, std::_List_const_iterator<char>, std::greater<void>>::difference_iterator(minuend_iterator, minuend_iterator, subtrahend_iterator, subtrahend_iterator, Compare) [ForwardIterator1 = std::_List_const_iterator<char>, ForwardIterator2 = std::_List_const_iterator<char>, Compare = std::greater<void>]"
               );
}

Assistant:

difference_iterator
            (
                minuend_iterator minuend_begin,
                minuend_iterator minuend_end,
                subtrahend_iterator subtrahend_begin,
                subtrahend_iterator subtrahend_end,
                Compare compare = Compare()
            ):
            m_minuend_begin(std::move(minuend_begin)),
            m_minuend_end(std::move(minuend_end)),
            m_subtrahend_begin(std::move(subtrahend_begin)),
            m_subtrahend_end(std::move(subtrahend_end)),
            m_compare(compare)
        {
            BOOST_ASSERT(std::is_sorted(m_minuend_begin, m_minuend_end, compare));
            BOOST_ASSERT(std::is_sorted(m_subtrahend_begin, m_subtrahend_end, compare));

            maintain_invariant();
        }